

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

IVec4 __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredImage::getPixelInt
          (LayeredImage *this,int x,int y,int z)

{
  undefined4 in_register_00000034;
  LayeredImage *this_00;
  int in_R8D;
  IVec4 IVar1;
  ConstPixelBufferAccess access;
  ConstPixelBufferAccess local_50;
  
  this_00 = (LayeredImage *)CONCAT44(in_register_00000034,x);
  if (this_00->m_type == TEXTURETYPE_CUBE) {
    getCubeFaceAccess(&local_50,this_00,
                      (&(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces)[in_R8D]);
  }
  else {
    getAccess(&local_50,this_00);
  }
  IVar1 = tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)this,(int)&local_50,y,z);
  IVar1.m_data._0_8_ = this;
  return (IVec4)IVar1.m_data;
}

Assistant:

IVec4 LayeredImage::getPixelInt (int x, int y, int z) const
{
	const ConstPixelBufferAccess access = m_type == TEXTURETYPE_CUBE ? getCubeFaceAccess(glslImageFuncZToCubeFace(z)) : getAccess();
	return access.getPixelInt(x, y, m_type == TEXTURETYPE_CUBE ? 0 : z);
}